

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O0

int nn_ctcp_create(nn_ep *ep)

{
  int iVar1;
  nn_fsm *owner;
  nn_usock *__s;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  nn_ep *in_RDI;
  size_t sz;
  int reconnect_ivl_max;
  int reconnect_ivl;
  nn_ctcp *self;
  size_t ipv4onlylen;
  int ipv4only;
  size_t sslen;
  sockaddr_storage ss;
  char *end;
  char *colon;
  char *hostname;
  char *semicolon;
  size_t addrlen;
  char *addr;
  int rc;
  nn_usock *name;
  nn_usock *self_00;
  nn_fsm_fn in_stack_ffffffffffffff08;
  long lVar5;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  nn_fsm *pnVar6;
  nn_ep *self_01;
  char *in_stack_ffffffffffffff28;
  size_t *in_stack_ffffffffffffff68;
  sockaddr_storage *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  int local_4;
  
  owner = (nn_fsm *)nn_alloc_(0x1ebcf9);
  if (owner == (nn_fsm *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
            ,0x84);
    fflush(_stderr);
    nn_err_abort();
  }
  owner[1].shutdown_fn = (nn_fsm_fn)in_RDI;
  nn_ep_tran_setup(in_RDI,&nn_ctcp_ep_ops,owner);
  self_01 = (nn_ep *)0x4;
  nn_ep_getopt((nn_ep *)0x4,(int)((ulong)owner >> 0x20),(int)owner,
               (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (size_t *)in_stack_ffffffffffffff08);
  if (self_01 != (nn_ep *)0x4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ipv4onlylen == sizeof (ipv4only)",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
            ,0x8d);
    fflush(_stderr);
    nn_err_abort();
  }
  __s = (nn_usock *)nn_ep_getaddr(in_RDI);
  sVar2 = strlen((char *)__s);
  pcVar3 = strchr((char *)__s,0x3b);
  name = __s;
  if (pcVar3 != (char *)0x0) {
    name = (nn_usock *)(pcVar3 + 1);
  }
  self_00 = name;
  pcVar4 = strrchr((char *)__s,0x3a);
  if (pcVar4 == (char *)0x0) {
    nn_free((void *)0x1ebec8);
    local_4 = -0x16;
  }
  else {
    iVar1 = nn_port_resolve(pcVar4 + 1,(size_t)((long)__s + (sVar2 - (long)pcVar4) + -1));
    if (iVar1 < 0) {
      nn_free((void *)0x1ebf1b);
      local_4 = -0x16;
    }
    else {
      iVar1 = nn_dns_check_hostname((char *)name,(long)pcVar4 - (long)name);
      if ((iVar1 < 0) &&
         (iVar1 = nn_literal_resolve(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                     in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                                     in_stack_ffffffffffffff68), iVar1 < 0)) {
        nn_free((void *)0x1ebf8d);
        local_4 = -0x16;
      }
      else if ((pcVar3 == (char *)0x0) ||
              (iVar1 = nn_iface_resolve(in_stack_ffffffffffffff28,(size_t)self_01,
                                        (int)((ulong)owner >> 0x20),
                                        (sockaddr_storage *)
                                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10
                                                ),(size_t *)in_stack_ffffffffffffff08), -1 < iVar1))
      {
        pnVar6 = owner;
        nn_ep_getctx((nn_ep *)0x1ec019);
        nn_fsm_init_root((nn_fsm *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff08,(nn_fsm_fn)self_00,(nn_ctx *)owner);
        (((nn_mutex *)&pnVar6[1].fn)->mutex).__data.__lock = 1;
        nn_usock_init(self_00,(int)((ulong)owner >> 0x20),(nn_fsm *)0x1ec057);
        lVar5 = 4;
        nn_ep_getopt(self_01,(int)((ulong)pnVar6 >> 0x20),(int)pnVar6,
                     (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (size_t *)0x4);
        if (lVar5 != 4) {
          nn_backtrace_print();
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
                  ,0xbb);
          fflush(_stderr);
          nn_err_abort();
        }
        lVar5 = 4;
        nn_ep_getopt(self_01,(int)((ulong)pnVar6 >> 0x20),(int)pnVar6,
                     (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (size_t *)0x4);
        if (lVar5 != 4) {
          nn_backtrace_print();
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl_max)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
                  ,0xbf);
          fflush(_stderr);
          nn_err_abort();
        }
        if (in_stack_ffffffffffffff10 == 0) {
          in_stack_ffffffffffffff10 = in_stack_ffffffffffffff14;
        }
        nn_backoff_init((nn_backoff *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        0,4,(int)((ulong)self_00 >> 0x20),owner);
        nn_stcp_init((nn_stcp *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (int)((ulong)lVar5 >> 0x20),(nn_ep *)self_00,owner);
        nn_dns_init((nn_dns *)self_00,(int)((ulong)owner >> 0x20),(nn_fsm *)0x1ec1d3);
        nn_fsm_start((nn_fsm *)0x1ec1dd);
        local_4 = 0;
      }
      else {
        nn_free((void *)0x1ebff1);
        local_4 = -0x13;
      }
    }
  }
  return local_4;
}

Assistant:

int nn_ctcp_create (struct nn_ep *ep)
{
    int rc;
    const char *addr;
    size_t addrlen;
    const char *semicolon;
    const char *hostname;
    const char *colon;
    const char *end;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    struct nn_ctcp *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_ctcp), "ctcp");
    alloc_assert (self);

    /*  Initalise the endpoint. */
    self->ep = ep;
    nn_ep_tran_setup (ep, &nn_ctcp_ep_ops, self);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Start parsing the address. */
    addr = nn_ep_getaddr (ep);
    addrlen = strlen (addr);
    semicolon = strchr (addr, ';');
    hostname = semicolon ? semicolon + 1 : addr;
    colon = strrchr (addr, ':');
    end = addr + addrlen;

    /*  Parse the port. */
    if (!colon) {
        nn_free (self);
        return -EINVAL;
    }
    rc = nn_port_resolve (colon + 1, end - colon - 1);
    if (rc < 0) {
        nn_free (self);
        return -EINVAL;
    }

    /*  Check whether the host portion of the address is either a literal
        or a valid hostname. */
    if (nn_dns_check_hostname (hostname, colon - hostname) < 0 &&
          nn_literal_resolve (hostname, colon - hostname, ipv4only,
          &ss, &sslen) < 0) {
        nn_free (self);
        return -EINVAL;
    }

    /*  If local address is specified, check whether it is valid. */
    if (semicolon) {
        rc = nn_iface_resolve (addr, semicolon - addr, ipv4only, &ss, &sslen);
        if (rc < 0) {
            nn_free (self);
            return -ENODEV;
        }
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_ctcp_handler, nn_ctcp_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_CTCP_STATE_IDLE;
    nn_usock_init (&self->usock, NN_CTCP_SRC_USOCK, &self->fsm);
    sz = sizeof (reconnect_ivl);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL, &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_CTCP_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_stcp_init (&self->stcp, NN_CTCP_SRC_STCP, ep, &self->fsm);
    nn_dns_init (&self->dns, NN_CTCP_SRC_DNS, &self->fsm);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    return 0;
}